

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gwham.hpp
# Opt level: O2

gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double> * __thiscall
WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
::calrho(gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>
         *__return_storage_ptr__,
        WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
        *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *_dim,pEnsemble *_V)

{
  pointer *this_00;
  pointer *__return_storage_ptr___00;
  uint *puVar1;
  pointer puVar2;
  element_type *peVar3;
  type pFVar4;
  ostream *poVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  uint uVar10;
  double extraout_XMM0_Qa;
  double dVar11;
  double dVar12;
  mapped_type mVar13;
  undefined1 local_c8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> histids;
  vector<double,_std::allocator<double>_> vals;
  coordtype rhocoord;
  coordtype coord;
  
  if ((ulong)this->dim <
      (ulong)((long)(_dim->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(_dim->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2)) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"The number of dimension can\'t be larger than ")
    ;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->dim);
  }
  else {
    std::operator<<((ostream *)&std::cout,"#Calculating probability density along dimension: ");
    pFVar4 = FormatStream<std::ostream>::operator<<((FormatStream<std::ostream> *)&fcout,_dim);
    std::endl<char,std::char_traits<char>>((ostream *)pFVar4->stream);
    puVar2 = (_dim->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    do {
      if ((ulong)((long)(_dim->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <= uVar9) {
        gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>::gnarray
                  (__return_storage_ptr__,&(this->DOS).DOS,_dim);
        this_00 = &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        for (p_Var8 = (this->record)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var8 != &(this->record)._M_t._M_impl.super__Rb_tree_header;
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(p_Var8 + 1));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c8,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var8[1]._M_right);
          __return_storage_ptr___00 =
               &histids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
          coord2val((vector<double,_std::allocator<double>_> *)__return_storage_ptr___00,this,
                    (coordtype *)
                    &rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
          peVar3 = (_V->super___shared_ptr<Ensemble,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          (**peVar3->_vptr_Ensemble)(peVar3,__return_storage_ptr___00);
          dVar11 = exp(-extraout_XMM0_Qa);
          vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          uVar10 = 0;
          while( true ) {
            puVar2 = (_dim->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            if ((ulong)((long)(_dim->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <=
                (ulong)uVar10) break;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                       rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + puVar2[uVar10]);
            uVar10 = uVar10 + 1;
          }
          dVar12 = gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>
                   ::operator[](&(this->DOS).DOS,
                                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                &rhocoord.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
          iVar6 = std::
                  _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
                  ::find((_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
                          *)__return_storage_ptr__,(key_type *)this_00);
          mVar13 = dVar11 * dVar12;
          if ((_Rb_tree_header *)iVar6._M_node ==
              &(__return_storage_ptr__->narr)._M_t._M_impl.super__Rb_tree_header) {
            pmVar7 = std::
                     map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
                     ::operator[](&__return_storage_ptr__->narr,(key_type *)this_00);
          }
          else {
            pmVar7 = std::
                     map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
                     ::operator[](&__return_storage_ptr__->narr,(key_type *)this_00);
            mVar13 = mVar13 + *pmVar7;
          }
          *pmVar7 = mVar13;
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)
                     &histids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_c8);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        return __return_storage_ptr__;
      }
      puVar1 = puVar2 + uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (*puVar1 < this->dim);
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "The dimension of probability density must be in the range of [0, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->dim - 1);
    poVar5 = std::operator<<(poVar5,"]");
  }
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(-1);
}

Assistant:

NARRAY WHAM<PENSEMBLE,HISTOGRAM,NARRAY>::calrho(const vector<uint>& _dim, const pEnsemble& _V) const {

  if(_dim.size() > dim) {
    cerr << "The number of dimension can't be larger than " << dim << endl;
    exit(-1);
  }

  cout << "#Calculating probability density along dimension: ";
  fcout << _dim << endl;

  //Construct the total bin-size in all the dimension 
  /*valtype binsize_sub = 1;
  for(uint i = 0; i < binsize.size(); ++i) {
    binsize_sub *= binsize[i];
    cout << "# " << i << " binsize_sub = " << binsize_sub << endl;
  }*/
  //Check if the _dim actually make sense, i.e., if they are in the range of [0, DOS.dim-1]
  //project out all the dimension irrelevent to the PMF BTW
  for(uint i = 0; i < _dim.size(); ++i) {
    if(_dim[i] >= dim) {
      cerr << "The dimension of probability density must be in the range of [0, " << dim-1  << "]" << endl;;
      exit(-1);
    }
    //const uint dimindex = _dim[i];
    //binsize_sub /= binsize[dimindex];
  }

  NARRAY rho(DOS.getdosarr(),_dim);
  //Again we only loop through non-zero elements of DOS
  for(map<coordtype, vector<uint> >::const_iterator it = record.begin(); it != record.end(); ++it) {
    const coordtype coord = it->first;
    const vector<uint> histids = it->second;
    const vector<valtype> vals = coord2val(coord);
    const valtype exparg = -_V->ener(vals);
    //if(exparg > MAXEXPARG ) { cerr << "In WHAM::calrho: exp("<<exparg<<") will overflow!\n"; exit(-1); }
    //else if(exparg < MINEXPARG) { continue; }
    const valtype weight = exp(exparg);

    //construct a vector<uint> as the coordinate of the PMF
    coordtype rhocoord;
    for(uint i = 0; i < _dim.size(); ++i) {
      rhocoord.push_back(coord[_dim[i]]);
    }
    
    //Update the PMF
    //cout << "#DOS[coord] = " << DOS[coord] << " exparg = " << exparg << " weight = " << weight << " binsize_sub = " << binsize_sub << endl;
    const valtype rhov = DOS[coord]*weight; //There should be a binsize factor here but if we only care about relative probability (density), it cancels out in the ratio
                                            //The reason why I didn't multiply with the binsize factor is that it could get very large in multidimensional cases
    const typename NARRAY::iterator rhoit = rho.find(rhocoord);
    if( rhoit != rho.end()) {
      rho[rhocoord] += rhov;
    }
    else {
      rho[rhocoord] = rhov; 
    }
  }
  return rho;
}